

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.h
# Opt level: O2

ChLoadXYZnodeBodyBushing * __thiscall
chrono::ChLoadXYZnodeBodyBushing::Clone(ChLoadXYZnodeBodyBushing *this)

{
  ChLoadXYZnodeBodyBushing *this_00;
  
  this_00 = (ChLoadXYZnodeBodyBushing *)::operator_new(0x348);
  ChLoadXYZnodeBodyBushing(this_00,this);
  return this_00;
}

Assistant:

virtual ChLoadXYZnodeBodyBushing* Clone() const override { return new ChLoadXYZnodeBodyBushing(*this); }